

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

bool __thiscall spvtools::opt::LoopPeelingPass::ProcessFunction(LoopPeelingPass *this,Function *f)

{
  Loop *loop;
  bool bVar1;
  pointer ppLVar2;
  Loop *l;
  LoopDescriptor *pLVar3;
  Loop *pLVar4;
  pointer ppLVar5;
  bool modified;
  anon_class_24_3_ffa921fa try_peel;
  vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> to_process_loop;
  iterator __end2;
  ScalarEvolutionAnalysis scev_analysis;
  bool local_169;
  LoopPeelingPass *local_168;
  anon_class_24_3_ffa921fa local_160;
  _Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> local_148;
  undefined1 local_130 [8];
  undefined1 local_128 [80];
  undefined1 local_d8 [168];
  
  local_169 = false;
  local_168 = this;
  pLVar3 = IRContext::GetLoopDescriptor((this->super_Pass).context_,f);
  local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::reserve
            ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&local_148,
             (long)(pLVar3->loops_).
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pLVar3->loops_).
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  PostOrderTreeDFIterator<spvtools::opt::Loop>::PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_d8,&pLVar3->placeholder_top_loop_
            );
  local_130 = (undefined1  [8])&pLVar3->placeholder_top_loop_;
  std::
  stack<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>>
  ::
  stack<std::deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>,void>
            ((stack<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>_>
              *)local_128);
  while ((undefined1  [8])local_d8._0_8_ != local_130) {
    local_160.loop_size = (CodeMetrics *)local_d8._0_8_;
    std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
    emplace_back<spvtools::opt::Loop*>
              ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)&local_148,
               (Loop **)&local_160);
    PostOrderTreeDFIterator<spvtools::opt::Loop>::MoveToNextNode
              ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_d8);
  }
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)local_128);
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)(local_d8 + 8));
  ScalarEvolutionAnalysis::ScalarEvolutionAnalysis
            ((ScalarEvolutionAnalysis *)local_d8,(local_168->super_Pass).context_);
  ppLVar2 = local_148._M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar5 = local_148._M_impl.super__Vector_impl_data._M_start; bVar1 = local_169,
      ppLVar5 != ppLVar2; ppLVar5 = ppLVar5 + 1) {
    loop = *ppLVar5;
    local_128._0_8_ = (_Map_pointer)0x1;
    local_128._8_8_ = (spv_operand_table)0x0;
    local_128._16_8_ = (spv_opcode_table)0x0;
    local_128._24_4_ = 0x3f800000;
    local_128._32_8_ = (_Elt_pointer)0x0;
    local_128._40_8_ =
         (__uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>)0x0;
    local_130 = (undefined1  [8])(local_128 + 0x28);
    CodeMetrics::Analyze((CodeMetrics *)local_130,loop);
    local_160.modified = &local_169;
    local_160.this = local_168;
    local_160.loop_size = (CodeMetrics *)local_130;
    pLVar4 = ProcessFunction::anon_class_24_3_ffa921fa::operator()(&local_160,loop);
    if (pLVar4 != (Loop *)0x0) {
      ProcessFunction::anon_class_24_3_ffa921fa::operator()(&local_160,loop);
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_130);
  }
  ScalarEvolutionAnalysis::~ScalarEvolutionAnalysis((ScalarEvolutionAnalysis *)local_d8);
  std::_Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::~_Vector_base
            (&local_148);
  return bVar1;
}

Assistant:

bool LoopPeelingPass::ProcessFunction(Function* f) {
  bool modified = false;
  LoopDescriptor& loop_descriptor = *context()->GetLoopDescriptor(f);

  std::vector<Loop*> to_process_loop;
  to_process_loop.reserve(loop_descriptor.NumLoops());
  for (Loop& l : loop_descriptor) {
    to_process_loop.push_back(&l);
  }

  ScalarEvolutionAnalysis scev_analysis(context());

  for (Loop* loop : to_process_loop) {
    CodeMetrics loop_size;
    loop_size.Analyze(*loop);

    auto try_peel = [&loop_size, &modified, this](Loop* loop_to_peel) -> Loop* {
      if (!loop_to_peel->IsLCSSA()) {
        LoopUtils(context(), loop_to_peel).MakeLoopClosedSSA();
      }

      bool peeled_loop;
      Loop* still_peelable_loop;
      std::tie(peeled_loop, still_peelable_loop) =
          ProcessLoop(loop_to_peel, &loop_size);

      if (peeled_loop) {
        modified = true;
      }

      return still_peelable_loop;
    };

    Loop* still_peelable_loop = try_peel(loop);
    // The pass is working out the maximum factor by which a loop can be peeled.
    // If the loop can potentially be peeled again, then there is only one
    // possible direction, so only one call is still needed.
    if (still_peelable_loop) {
      try_peel(loop);
    }
  }

  return modified;
}